

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d64_q1a_card_battle.cpp
# Opt level: O2

int main(void)

{
  undefined1 *puVar1;
  _Rb_tree_header *p_Var2;
  istream *this;
  mapped_type *pmVar3;
  long lVar4;
  iterator __position;
  ostream *poVar5;
  int i;
  int iVar6;
  int iVar7;
  int tmp;
  int t;
  int m;
  int n;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> to_pow;
  int local_70;
  int local_6c;
  int local_68;
  int local_64;
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  local_60;
  
  std::ios_base::sync_with_stdio(false);
  *(undefined8 *)(*(long *)(std::cin + -0x18) + 0x105190) = 0;
  this = (istream *)std::istream::operator>>((istream *)&std::cin,&local_64);
  std::istream::operator>>(this,&local_68);
  p_Var2 = &local_60._M_impl.super__Rb_tree_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  iVar6 = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  for (; iVar6 < local_64; iVar6 = iVar6 + 1) {
    std::istream::operator>>((istream *)&std::cin,&local_70);
    pmVar3 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
             operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                         *)&local_60,&local_70);
    *pmVar3 = *pmVar3 + 1;
  }
  iVar6 = 0;
  do {
    if (local_68 <= iVar6) {
      poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar6 + 1);
      std::operator<<(poVar5,"\n");
LAB_001013bf:
      std::
      _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
      ::~_Rb_tree(&local_60);
      return 0;
    }
    std::istream::operator>>((istream *)&std::cin,&local_70);
    for (iVar7 = 0; iVar7 < local_70; iVar7 = iVar7 + 1) {
      std::istream::operator>>((istream *)&std::cin,&local_6c);
      if (local_60._M_impl.super__Rb_tree_header._M_node_count == 0) {
LAB_001013a0:
        poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar6 + 1);
        std::operator<<(poVar5,"\n");
        goto LAB_001013bf;
      }
      lVar4 = std::_Rb_tree_decrement(&p_Var2->_M_header);
      if (*(int *)(lVar4 + 0x20) <= local_6c) goto LAB_001013a0;
      __position = std::
                   _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                   ::upper_bound(&local_60,&local_6c);
      if ((_Rb_tree_header *)__position._M_node == p_Var2) {
        __position._M_node = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
      }
      puVar1 = &__position._M_node[1].field_0x4;
      *(int *)puVar1 = *(int *)puVar1 + -1;
      if (*(int *)puVar1 == 0) {
        std::
        _Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
        ::erase_abi_cxx11_((_Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
                            *)&local_60,__position);
      }
    }
    iVar6 = iVar6 + 1;
  } while( true );
}

Assistant:

int main() {
    ios::sync_with_stdio(false);
    cin.tie(0);

    int n, m;
    cin >> n >> m;
    map<int,int> to_pow;
    for (int i = 0; i < n; ++i) {
        // cin >> to_pow[i];
        int tmp;
        cin >> tmp;
        ++to_pow[tmp];
    }
    int winnings = 0;
    for (int i = 0; i < m; ++i) {
        int c,t;
        cin >> c;
        for (int j = 0; j < c; ++j) {
            cin >> t;
            auto end = --to_pow.end();
            if (to_pow.size() == 0 || end->first <= t) {
                cout << winnings + 1 << "\n";
                return 0;
            }
            // auto used_card = upper_bound(to_pow.begin() + new_beg, to_pow.end(), t);
            auto used_card = to_pow.upper_bound(t);
            if (used_card == to_pow.end()) {
                // to_pow.erase(to_pow.begin());
                to_pow.begin()->second--;
                if (to_pow.begin()->second == 0) {
                    to_pow.erase(to_pow.begin());
                }
            } else {
                // to_pow.erase(used_card);
                used_card->second--;
                if (used_card->second == 0) {
                    to_pow.erase(used_card);
                }
            }
        }
        ++winnings;
    }
    cout << winnings + 1 << "\n";
}